

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restclient.cpp
# Opt level: O2

void __thiscall YdiskRestClient::downloadFile(YdiskRestClient *this,string *path,ofstream *ofstream)

{
  bool bVar1;
  Json *pJVar2;
  runtime_error *this_00;
  char *this_01;
  YdiskRestClient *pYVar3;
  allocator local_119;
  Json json;
  string error;
  string local_e8;
  __shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2> local_c8;
  shared_ptr<httplib::Response> r;
  string url;
  string local_88;
  YdiskRestClient local_68;
  
  this_01 = "/v1/disk/resources/download?path=";
  std::__cxx11::string::string
            ((string *)&url,"/v1/disk/resources/download?path=",(allocator *)&error);
  url_encode(&error,(YdiskRestClient *)this_01,path);
  std::__cxx11::string::append((string *)&url);
  std::__cxx11::string::~string((string *)&error);
  local_68.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_68.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_68.headers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  httplib::Client::Get
            ((Client *)&r,(char *)this->http_client,(Headers *)url._M_dataplus._M_p,
             (Progress *)&this->headers);
  pYVar3 = (YdiskRestClient *)
           ((long)&local_68.headers._M_t._M_impl.super__Rb_tree_header._M_header + 8);
  std::_Function_base::~_Function_base((_Function_base *)pYVar3);
  if ((r.super___shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
       (element_type *)0x0) ||
     ((r.super___shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->status != 200))
  {
    throw_response_error
              (pYVar3,r.super___shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  else {
    error._M_dataplus._M_p = (pointer)&error.field_2;
    error._M_string_length = 0;
    error.field_2._M_local_buf[0] = '\0';
    json11::Json::parse(&json,&(r.super___shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->body,&error,STANDARD);
    std::__shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_c8,(__shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2> *)&json);
    pYVar3 = &local_68;
    std::__cxx11::string::string((string *)pYVar3,(string *)&error);
    check_parsing_result(pYVar3,(Json *)&local_c8,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8._M_refcount);
    std::__cxx11::string::string((string *)&local_e8,"href",&local_119);
    pJVar2 = json11::Json::operator[](&json,&local_e8);
    bVar1 = json11::Json::is_string(pJVar2);
    std::__cxx11::string::~string((string *)&local_e8);
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_e8,"href",&local_119);
      pJVar2 = json11::Json::operator[](&json,&local_e8);
      json11::Json::string_value_abi_cxx11_(pJVar2);
      std::__cxx11::string::_M_assign((string *)&url);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&json.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__cxx11::string::~string((string *)&error);
      std::__cxx11::string::string((string *)&local_88,(string *)&url);
      _do_download(this,&local_88,ofstream);
      std::__cxx11::string::~string((string *)&local_88);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&r.super___shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__cxx11::string::~string((string *)&url);
      return;
    }
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Wrong json format");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void YdiskRestClient::downloadFile(std::string path, std::ofstream &ofstream)
{
    std::string url("/v1/disk/resources/download?path=");
    url += url_encode(path);

    //Get download link
    auto r = http_client->Get(url.c_str(), headers);
    if(r.get() && r->status==200){
        std::string error;
        const auto json = Json::parse(r->body, error);
        check_parsing_result(json, error);
        if(!json["href"].is_string())
            throw std::runtime_error("Wrong json format");

        url = json["href"].string_value();
    } else {
        throw_response_error(r.get());
    }

    _do_download(url, ofstream);

}